

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O1

bool __thiscall IntVarSL::remVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  Tchar *pTVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  TrailElem local_40;
  
  iVar3 = (this->values).sz - 1;
  iVar5 = 0;
  do {
    uVar4 = (iVar3 + iVar5) / 2;
    iVar1 = (this->values).data[uVar4];
    if (iVar1 == (int)v) goto LAB_0013be5f;
    if (iVar1 < (int)v) {
      iVar5 = uVar4 + 1;
    }
    else {
      iVar3 = uVar4 - 1;
    }
  } while (iVar5 <= iVar3);
  uVar4 = 0xffffffff;
LAB_0013be5f:
  iVar3 = (*(this->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x11])
                    (this->el,(long)(int)uVar4,r.field_0,(ulong)channel);
  if (SUB41(iVar3,0) != false) {
    pTVar2 = (this->super_IntVar).vals;
    local_40.pt = (int *)(pTVar2 + v);
    local_40.x = (int)pTVar2[v].v;
    local_40.sz = 1;
    vec<TrailElem>::push(&engine.trail,&local_40);
    pTVar2[v].v = '\0';
    iVar5 = (this->values).data[(uint)(this->el->super_IntVar).min.v];
    local_40.pt = &(this->super_IntVar).min.v;
    local_40.x = (this->super_IntVar).min.v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (this->super_IntVar).min.v = iVar5;
    iVar5 = (this->values).data[(uint)(this->el->super_IntVar).max.v];
    local_40.pt = &(this->super_IntVar).max.v;
    local_40.x = (this->super_IntVar).max.v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (this->super_IntVar).max.v = iVar5;
  }
  return SUB41(iVar3,0);
}

Assistant:

bool IntVarSL::remVal(int64_t v, Reason r, bool channel) {
	assert(remValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	assert(u != -1);
	if (!el->remVal(u, r, channel)) {
		return false;
	}
	vals[v] = 0;
	min = values[el->min];
	max = values[el->max];
	return true;
}